

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O3

void alGenEffects(ALsizei n,ALuint *effects)

{
  vector<EffectSubList> *this;
  pointer *ppEVar1;
  ALCdevice *pAVar2;
  pointer pEVar3;
  iterator __position;
  ulong __n;
  pointer ptr;
  int iVar4;
  pointer pEVar5;
  ALeffect *pAVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  EffectSubList *pEVar10;
  ContextRef context;
  vector<ALuint> ids;
  ALCcontext *local_58;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> local_48;
  
  __n = (ulong)(uint)n;
  GetContextRef();
  if (local_58 != (ALCcontext *)0x0) {
    if (n < 0) {
      ALCcontext::setError(local_58,0xa003,"Generating %d effects",__n);
    }
    else if (n != 0) {
      pAVar2 = (local_58->mDevice).mPtr;
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)&pAVar2->EffectLock);
      if (iVar4 != 0) {
        std::__throw_system_error(iVar4);
      }
      pEVar5 = (pAVar2->EffectList).
               super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar3 = (pAVar2->EffectList).
               super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pEVar5 == pEVar3) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        do {
          uVar9 = pEVar5->FreeMask - (pEVar5->FreeMask >> 1 & 0x5555555555555555);
          uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
          uVar7 = uVar7 + (((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
          pEVar5 = pEVar5 + 1;
        } while (pEVar5 != pEVar3);
      }
      this = &pAVar2->EffectList;
      ppEVar1 = &(pAVar2->EffectList).
                 super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (; uVar7 < __n; uVar7 = uVar7 + 0x40) {
        __position._M_current = *ppEVar1;
        if (0x1ffffff0 <
            (ulong)((long)__position._M_current -
                   (long)(this->
                         super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>).
                         _M_impl.super__Vector_impl_data._M_start)) {
LAB_0011c8e7:
          pcVar8 = "s";
          if (n == 1) {
            pcVar8 = "";
          }
          ALCcontext::setError
                    (local_58,0xa005,"Failed to allocate %d effect%s",(ulong)(uint)n,pcVar8);
          goto LAB_0011c8b9;
        }
        if (__position._M_current ==
            (pAVar2->EffectList).
            super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<EffectSubList,_al::allocator<EffectSubList,_8UL>_>::_M_realloc_insert<>
                    (this,__position);
          pEVar10 = *ppEVar1;
        }
        else {
          (__position._M_current)->FreeMask = 0xffffffffffffffff;
          (__position._M_current)->Effects = (ALeffect *)0x0;
          pEVar10 = __position._M_current + 1;
          *ppEVar1 = pEVar10;
        }
        pEVar10[-1].FreeMask = 0xffffffffffffffff;
        pAVar6 = (ALeffect *)al_calloc(8,0x2000);
        pEVar10[-1].Effects = pAVar6;
        if (pAVar6 == (ALeffect *)0x0) {
          alGenEffects_cold_1();
          goto LAB_0011c8e7;
        }
      }
      if (n == 1) {
        pAVar6 = anon_unknown.dwarf_25011::AllocEffect
                           ((anon_unknown_dwarf_25011 *)
                            (this->
                            super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>).
                            _M_impl.super__Vector_impl_data._M_start,(ALCdevice *)*ppEVar1);
        *effects = pAVar6->id;
      }
      else {
        local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve(&local_48,__n);
        do {
          pAVar6 = anon_unknown.dwarf_25011::AllocEffect
                             ((anon_unknown_dwarf_25011 *)
                              (this->
                              super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>)
                              ._M_impl.super__Vector_impl_data._M_start,(ALCdevice *)*ppEVar1);
          if (local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::
            _M_realloc_insert<unsigned_int&>
                      ((vector<unsigned_int,al::allocator<unsigned_int,4ul>> *)&local_48,
                       (iterator)
                       local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&pAVar6->id);
          }
          else {
            *local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
             super__Vector_impl_data._M_finish = pAVar6->id;
            local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          ptr = local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                .super__Vector_impl_data._M_start;
          n = n + -1;
        } while (n != 0);
        if ((long)local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          memmove(effects,local_48.
                          super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        }
        if (ptr != (pointer)0x0) {
          al_free(ptr);
        }
      }
LAB_0011c8b9:
      pthread_mutex_unlock((pthread_mutex_t *)&pAVar2->EffectLock);
    }
    if (local_58 != (ALCcontext *)0x0) {
      al::intrusive_ref<ALCcontext>::release(&local_58->super_intrusive_ref<ALCcontext>);
    }
  }
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenEffects(ALsizei n, ALuint *effects)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d effects", n);
    if UNLIKELY(n <= 0) return;

    ALCdevice *device{context->mDevice.get()};
    std::lock_guard<std::mutex> _{device->EffectLock};
    if(!EnsureEffects(device, static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d effect%s", n, (n==1)?"":"s");
        return;
    }

    if LIKELY(n == 1)
    {
        /* Special handling for the easy and normal case. */
        ALeffect *effect{AllocEffect(device)};
        effects[0] = effect->id;
    }
    else
    {
        /* Store the allocated buffer IDs in a separate local list, to avoid
         * modifying the user storage in case of failure.
         */
        al::vector<ALuint> ids;
        ids.reserve(static_cast<ALuint>(n));
        do {
            ALeffect *effect{AllocEffect(device)};
            ids.emplace_back(effect->id);
        } while(--n);
        std::copy(ids.cbegin(), ids.cend(), effects);
    }